

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTargetInternals::ComputeLinkInterfaceLibraries
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,OptionalLinkInterface *iface,
          cmTarget *headTarget,bool usage_requirements_only)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  char *pcVar5;
  char *__s1;
  ostream *poVar6;
  LinkImplementationLibraries *r;
  PolicyID id;
  PolicyID id_00;
  string oldLibraries;
  string linkIfaceProp;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> ifaceLibs;
  string local_208;
  string newLibraries;
  string suffix;
  ostringstream w;
  
  std::__cxx11::string::string((string *)&suffix,"_",(allocator *)&w);
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&suffix);
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&w,config);
    std::__cxx11::string::append((string *)&suffix);
    std::__cxx11::string::~string((string *)&w);
  }
  linkIfaceProp._M_dataplus._M_p = (pointer)&linkIfaceProp.field_2;
  linkIfaceProp._M_string_length = 0;
  linkIfaceProp.field_2._M_local_buf[0] = '\0';
  PVar3 = cmTarget::GetPolicyStatusCMP0022(thisTarget);
  if ((PVar3 == OLD) || (PVar3 = cmTarget::GetPolicyStatusCMP0022(thisTarget), PVar3 == WARN)) {
    if ((thisTarget->TargetTypeValue != SHARED_LIBRARY) &&
       (bVar2 = cmTarget::IsExecutableWithExports(thisTarget), !bVar2)) goto LAB_0031f230;
    std::__cxx11::string::assign((char *)&linkIfaceProp);
    std::__cxx11::string::append((string *)&linkIfaceProp);
    pcVar5 = cmTarget::GetProperty(thisTarget,&linkIfaceProp);
    if (pcVar5 == (char *)0x0) goto LAB_0031effc;
  }
  else {
LAB_0031effc:
    std::__cxx11::string::assign((char *)&linkIfaceProp);
    pcVar5 = cmTarget::GetProperty(thisTarget,&linkIfaceProp);
    if (pcVar5 == (char *)0x0) {
LAB_0031f230:
      if ((thisTarget->TargetTypeValue != EXECUTABLE) &&
         (thisTarget->TargetTypeValue != MODULE_LIBRARY)) {
        (iface->super_LinkInterface).field_0x6b = 1;
        iface->ExplicitLibraries = (char *)0x0;
        PVar3 = cmTarget::GetPolicyStatusCMP0022(thisTarget);
        if ((PVar3 == WARN) || (PVar3 = cmTarget::GetPolicyStatusCMP0022(thisTarget), PVar3 == OLD))
        {
          r = cmTarget::GetLinkImplementationLibrariesInternal(thisTarget,config,headTarget);
          std::vector<cmLinkItem,std::allocator<cmLinkItem>>::
          insert<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>,void>
                    ((vector<cmLinkItem,std::allocator<cmLinkItem>> *)iface,
                     (iface->super_LinkInterface).super_LinkInterfaceLibraries.Libraries.
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (r->Libraries).
                     super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (r->Libraries).
                     super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          PVar3 = cmTarget::GetPolicyStatusCMP0022(thisTarget);
          if ((PVar3 == WARN) && (!usage_requirements_only && this->PolicyWarnedCMP0022 == false)) {
            ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            if ((ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                 ::newProp_abi_cxx11_ == '\0') &&
               (iVar4 = __cxa_guard_acquire(&ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                                             ::newProp_abi_cxx11_), iVar4 != 0)) {
              std::__cxx11::string::string
                        ((string *)
                         &ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                          ::newProp_abi_cxx11_,"INTERFACE_LINK_LIBRARIES",(allocator *)&w);
              __cxa_atexit(std::__cxx11::string::~string,
                           &ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                            ::newProp_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                                   ::newProp_abi_cxx11_);
            }
            pcVar5 = cmTarget::GetProperty
                               (thisTarget,
                                &ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                                 ::newProp_abi_cxx11_);
            if (pcVar5 != (char *)0x0) {
              std::__cxx11::string::string((string *)&w,pcVar5,(allocator *)&newLibraries);
              cmTarget::ExpandLinkItems
                        (thisTarget,
                         &ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                          ::newProp_abi_cxx11_,(string *)&w,config,headTarget,false,&ifaceLibs,
                         (bool *)&oldLibraries);
              std::__cxx11::string::~string((string *)&w);
            }
            bVar2 = std::operator!=(&ifaceLibs,
                                    (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
            if (bVar2) {
              cmJoin<std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
                        (&oldLibraries,&r->Libraries,";");
              cmJoin<std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
                        (&newLibraries,&ifaceLibs,";");
              if (oldLibraries._M_string_length == 0) {
                std::__cxx11::string::assign((char *)&oldLibraries);
              }
              if (newLibraries._M_string_length == 0) {
                std::__cxx11::string::assign((char *)&newLibraries);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_208,(cmPolicies *)0x16,id_00);
              poVar6 = std::operator<<((ostream *)&w,(string *)&local_208);
              poVar6 = std::operator<<(poVar6,"\nTarget \"");
              poVar6 = std::operator<<(poVar6,(string *)&thisTarget->Name);
              poVar6 = std::operator<<(poVar6,
                                       "\" has an INTERFACE_LINK_LIBRARIES property.  This should be preferred as the source of the link interface for this library but because CMP0022 is not set CMake is ignoring the property and using the link implementation as the link interface instead.\nINTERFACE_LINK_LIBRARIES:\n  "
                                      );
              poVar6 = std::operator<<(poVar6,(string *)&newLibraries);
              poVar6 = std::operator<<(poVar6,"\nLink implementation:\n  ");
              poVar6 = std::operator<<(poVar6,(string *)&oldLibraries);
              std::operator<<(poVar6,"\n");
              std::__cxx11::string::~string((string *)&local_208);
              pcVar1 = thisTarget->Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_208);
              std::__cxx11::string::~string((string *)&local_208);
              this->PolicyWarnedCMP0022 = true;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
              std::__cxx11::string::~string((string *)&newLibraries);
              std::__cxx11::string::~string((string *)&oldLibraries);
            }
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&ifaceLibs);
          }
        }
      }
      goto LAB_0031f207;
    }
  }
  PVar3 = cmTarget::GetPolicyStatusCMP0022(thisTarget);
  if ((PVar3 == WARN) && (this->PolicyWarnedCMP0022 == false)) {
    std::__cxx11::string::string((string *)&w,"INTERFACE_LINK_LIBRARIES",(allocator *)&oldLibraries)
    ;
    __s1 = cmTarget::GetProperty(thisTarget,(string *)&w);
    std::__cxx11::string::~string((string *)&w);
    if ((__s1 != (char *)0x0) && (iVar4 = strcmp(__s1,pcVar5), iVar4 != 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&oldLibraries,(cmPolicies *)0x16,id);
      poVar6 = std::operator<<((ostream *)&w,(string *)&oldLibraries);
      poVar6 = std::operator<<(poVar6,"\nTarget \"");
      poVar6 = std::operator<<(poVar6,(string *)&thisTarget->Name);
      poVar6 = std::operator<<(poVar6,
                               "\" has an INTERFACE_LINK_LIBRARIES property which differs from its "
                              );
      poVar6 = std::operator<<(poVar6,(string *)&linkIfaceProp);
      poVar6 = std::operator<<(poVar6," properties.\nINTERFACE_LINK_LIBRARIES:\n  ");
      poVar6 = std::operator<<(poVar6,__s1);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,(string *)&linkIfaceProp);
      poVar6 = std::operator<<(poVar6,":\n  ");
      poVar6 = std::operator<<(poVar6,pcVar5);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&oldLibraries);
      pcVar1 = thisTarget->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&oldLibraries);
      std::__cxx11::string::~string((string *)&oldLibraries);
      this->PolicyWarnedCMP0022 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
    }
  }
  (iface->super_LinkInterface).field_0x6b = 1;
  iface->ExplicitLibraries = pcVar5;
  std::__cxx11::string::string((string *)&w,pcVar5,(allocator *)&oldLibraries);
  cmTarget::ExpandLinkItems
            (thisTarget,&linkIfaceProp,(string *)&w,config,headTarget,usage_requirements_only,
             (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface,
             (bool *)&(iface->super_LinkInterface).field_0x6c);
  std::__cxx11::string::~string((string *)&w);
LAB_0031f207:
  std::__cxx11::string::~string((string *)&linkIfaceProp);
  std::__cxx11::string::~string((string *)&suffix);
  return;
}

Assistant:

void
cmTargetInternals::ComputeLinkInterfaceLibraries(
  cmTarget const* thisTarget,
  const std::string& config,
  OptionalLinkInterface& iface,
  cmTarget const* headTarget,
  bool usage_requirements_only)
{
  // Construct the property name suffix for this configuration.
  std::string suffix = "_";
  if(!config.empty())
    {
    suffix += cmSystemTools::UpperCase(config);
    }
  else
    {
    suffix += "NOCONFIG";
    }

  // An explicit list of interface libraries may be set for shared
  // libraries and executables that export symbols.
  const char* explicitLibraries = 0;
  std::string linkIfaceProp;
  if(thisTarget->GetPolicyStatusCMP0022() != cmPolicies::OLD &&
     thisTarget->GetPolicyStatusCMP0022() != cmPolicies::WARN)
    {
    // CMP0022 NEW behavior is to use INTERFACE_LINK_LIBRARIES.
    linkIfaceProp = "INTERFACE_LINK_LIBRARIES";
    explicitLibraries = thisTarget->GetProperty(linkIfaceProp);
    }
  else if(thisTarget->GetType() == cmTarget::SHARED_LIBRARY ||
          thisTarget->IsExecutableWithExports())
    {
    // CMP0022 OLD behavior is to use LINK_INTERFACE_LIBRARIES if set on a
    // shared lib or executable.

    // Lookup the per-configuration property.
    linkIfaceProp = "LINK_INTERFACE_LIBRARIES";
    linkIfaceProp += suffix;
    explicitLibraries = thisTarget->GetProperty(linkIfaceProp);

    // If not set, try the generic property.
    if(!explicitLibraries)
      {
      linkIfaceProp = "LINK_INTERFACE_LIBRARIES";
      explicitLibraries = thisTarget->GetProperty(linkIfaceProp);
      }
    }

  if(explicitLibraries &&
     thisTarget->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
     !this->PolicyWarnedCMP0022)
    {
    // Compare the explicitly set old link interface properties to the
    // preferred new link interface property one and warn if different.
    const char* newExplicitLibraries =
      thisTarget->GetProperty("INTERFACE_LINK_LIBRARIES");
    if (newExplicitLibraries
        && strcmp(newExplicitLibraries, explicitLibraries) != 0)
      {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
        "Target \"" << thisTarget->GetName() << "\" has an "
        "INTERFACE_LINK_LIBRARIES property which differs from its " <<
        linkIfaceProp << " properties."
        "\n"
        "INTERFACE_LINK_LIBRARIES:\n"
        "  " << newExplicitLibraries << "\n" <<
        linkIfaceProp << ":\n"
        "  " << (explicitLibraries ? explicitLibraries : "(empty)") << "\n";
      thisTarget->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
      this->PolicyWarnedCMP0022 = true;
      }
    }

  // There is no implicit link interface for executables or modules
  // so if none was explicitly set then there is no link interface.
  if(!explicitLibraries &&
     (thisTarget->GetType() == cmTarget::EXECUTABLE ||
      (thisTarget->GetType() == cmTarget::MODULE_LIBRARY)))
    {
    return;
    }
  iface.Exists = true;
  iface.ExplicitLibraries = explicitLibraries;

  if(explicitLibraries)
    {
    // The interface libraries have been explicitly set.
    thisTarget->ExpandLinkItems(linkIfaceProp, explicitLibraries, config,
                                headTarget, usage_requirements_only,
                                iface.Libraries,
                                iface.HadHeadSensitiveCondition);
    }
  else if (thisTarget->GetPolicyStatusCMP0022() == cmPolicies::WARN
        || thisTarget->GetPolicyStatusCMP0022() == cmPolicies::OLD)
    // If CMP0022 is NEW then the plain tll signature sets the
    // INTERFACE_LINK_LIBRARIES, so if we get here then the project
    // cleared the property explicitly and we should not fall back
    // to the link implementation.
    {
    // The link implementation is the default link interface.
    cmTarget::LinkImplementationLibraries const* impl =
      thisTarget->GetLinkImplementationLibrariesInternal(config, headTarget);
    iface.Libraries.insert(iface.Libraries.end(),
                           impl->Libraries.begin(), impl->Libraries.end());
    if(thisTarget->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
       !this->PolicyWarnedCMP0022 && !usage_requirements_only)
      {
      // Compare the link implementation fallback link interface to the
      // preferred new link interface property and warn if different.
      std::vector<cmLinkItem> ifaceLibs;
      static const std::string newProp = "INTERFACE_LINK_LIBRARIES";
      if(const char* newExplicitLibraries = thisTarget->GetProperty(newProp))
        {
        bool hadHeadSensitiveConditionDummy = false;
        thisTarget->ExpandLinkItems(newProp, newExplicitLibraries, config,
                                    headTarget, usage_requirements_only,
                                ifaceLibs, hadHeadSensitiveConditionDummy);
        }
      if (ifaceLibs != iface.Libraries)
        {
        std::string oldLibraries = cmJoin(impl->Libraries, ";");
        std::string newLibraries = cmJoin(ifaceLibs, ";");
        if(oldLibraries.empty())
          { oldLibraries = "(empty)"; }
        if(newLibraries.empty())
          { newLibraries = "(empty)"; }

        std::ostringstream w;
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
          "Target \"" << thisTarget->GetName() << "\" has an "
          "INTERFACE_LINK_LIBRARIES property.  "
          "This should be preferred as the source of the link interface "
          "for this library but because CMP0022 is not set CMake is "
          "ignoring the property and using the link implementation "
          "as the link interface instead."
          "\n"
          "INTERFACE_LINK_LIBRARIES:\n"
          "  " << newLibraries << "\n"
          "Link implementation:\n"
          "  " << oldLibraries << "\n";
        thisTarget->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
        this->PolicyWarnedCMP0022 = true;
        }
      }
    }
}